

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman_tests.cpp
# Opt level: O3

void __thiscall addrman_tests::addrman_select::test_method(addrman_select *this)

{
  _Head_base<0UL,_AddrMan_*,_false> _Var1;
  bool bVar2;
  readonly_property65 rVar3;
  uint16_t uVar4;
  int32_t consistency_check_ratio;
  AddrMan *this_00;
  time_point tVar5;
  int iVar6;
  iterator in_R8;
  iterator pvVar7;
  iterator in_R9;
  iterator pvVar8;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  initializer_list<CAddress> __l;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  initializer_list<CAddress> __l_00;
  const_string file_11;
  const_string file_12;
  initializer_list<CAddress> __l_01;
  const_string file_13;
  initializer_list<CAddress> __l_02;
  const_string file_14;
  initializer_list<CAddress> __l_03;
  const_string file_15;
  const_string file_16;
  initializer_list<CAddress> __l_04;
  const_string file_17;
  const_string file_18;
  initializer_list<CAddress> __l_05;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  __single_object addrman;
  set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_> ports;
  check_type cVar10;
  char *pcVar9;
  char local_84c [4];
  size_t local_848;
  undefined1 *local_840;
  undefined1 *local_838;
  char *local_830;
  char *local_828;
  undefined1 *local_820;
  undefined1 *local_818;
  char *local_810;
  char *local_808;
  char *local_800;
  char *local_7f8;
  undefined1 *local_7f0;
  undefined1 *local_7e8;
  char *local_7e0;
  char *local_7d8;
  char *local_7d0;
  char *local_7c8;
  size_t *local_7c0;
  char *local_7b8;
  assertion_result local_7b0;
  size_t **local_798;
  vector<CAddress,_std::allocator<CAddress>_> local_790;
  undefined1 *local_778;
  undefined1 *local_770;
  char *local_768;
  char *local_760;
  char *local_758;
  char *local_750;
  undefined1 *local_748;
  undefined1 *local_740;
  char *local_738;
  char *local_730;
  char *local_728;
  char *local_720;
  undefined1 *local_718;
  undefined1 *local_710;
  char *local_708;
  char *local_700;
  char *local_6f8;
  char *local_6f0;
  undefined1 *local_6e8;
  undefined1 *local_6e0;
  char *local_6d8;
  char *local_6d0;
  char *local_6c8;
  char *local_6c0;
  undefined1 *local_6b8;
  undefined1 *local_6b0;
  char *local_6a8;
  char *local_6a0;
  char *local_698;
  char *local_690;
  undefined1 *local_688;
  undefined1 *local_680;
  char *local_678;
  char *local_670;
  char *local_668;
  char *local_660;
  undefined1 *local_658;
  undefined1 *local_650;
  char *local_648;
  char *local_640;
  char *local_638;
  char *local_630;
  undefined1 *local_628;
  undefined1 *local_620;
  char *local_618;
  char *local_610;
  char *local_608;
  char *local_600;
  undefined1 *local_5f8;
  undefined1 *local_5f0;
  char *local_5e8;
  char *local_5e0;
  undefined1 *local_5d8;
  undefined1 *local_5d0;
  char *local_5c8;
  char *local_5c0;
  char *local_5b8;
  char *local_5b0;
  undefined1 *local_5a8;
  undefined1 *local_5a0;
  char *local_598;
  char *local_590;
  char *local_588;
  char *local_580;
  undefined1 *local_578;
  undefined1 *local_570;
  char *local_568;
  char *local_560;
  undefined1 *local_558;
  undefined1 *local_550;
  char *local_548;
  char *local_540;
  char *local_538;
  char *local_530;
  undefined1 *local_528;
  undefined1 *local_520;
  char *local_518;
  char *local_510;
  char *local_508;
  char *local_500;
  undefined1 *local_4f8;
  undefined1 *local_4f0;
  char *local_4e8;
  char *local_4e0;
  char *local_4d8;
  char *local_4d0;
  undefined1 *local_4c8;
  undefined1 *local_4c0;
  char *local_4b8;
  char *local_4b0;
  undefined1 *local_4a8;
  undefined1 *local_4a0;
  char *local_498;
  char *local_490;
  char *local_488;
  char *local_480;
  undefined1 *local_478;
  undefined1 *local_470;
  char *local_468;
  char *local_460;
  char *local_458;
  char *local_450;
  undefined1 *local_448;
  undefined1 *local_440;
  char *local_438;
  char *local_430;
  char *local_428;
  char *local_420;
  undefined1 *local_418;
  undefined1 *local_410;
  char *local_408;
  char *local_400;
  _Head_base<0UL,_AddrMan_*,_false> local_3f8;
  undefined1 local_3f0 [8];
  assertion_result local_3e8;
  undefined1 local_3d0 [8];
  NodeSeconds local_3c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_3c0;
  _Base_ptr local_3b0;
  size_t local_3a8;
  direct_or_indirect local_3a0;
  uint local_390;
  Network local_388;
  uint32_t uStack_384;
  uint16_t local_380;
  direct_or_indirect local_378;
  uint local_368;
  Network local_360;
  uint32_t uStack_35c;
  uint16_t local_358;
  direct_or_indirect local_350;
  uint local_340;
  Network local_338;
  uint32_t uStack_334;
  uint16_t local_330;
  direct_or_indirect local_328;
  uint local_318;
  Network local_310;
  uint32_t uStack_30c;
  uint16_t local_308;
  direct_or_indirect local_300;
  uint local_2f0;
  undefined ***local_2e8;
  uint16_t local_2e0;
  direct_or_indirect local_2d8;
  uint local_2c8;
  undefined ***local_2c0;
  uint16_t local_2b8;
  direct_or_indirect local_2b0;
  uint local_2a0;
  Network local_298;
  uint32_t uStack_294;
  uint16_t local_290;
  direct_or_indirect local_288;
  shared_count asStack_278 [2];
  uint16_t local_268;
  direct_or_indirect local_260;
  undefined1 *local_250;
  undefined ***local_248;
  uint16_t local_240;
  direct_or_indirect local_238;
  uint local_228;
  Network local_220;
  uint32_t uStack_21c;
  uint16_t local_218;
  direct_or_indirect local_210;
  uint local_200;
  Network local_1f8;
  uint32_t uStack_1f4;
  uint16_t local_1f0;
  direct_or_indirect local_1e8;
  uint local_1d8;
  Network local_1d0;
  uint32_t uStack_1cc;
  uint16_t local_1c8;
  direct_or_indirect local_1c0;
  shared_count asStack_1b0 [2];
  uint16_t local_1a0;
  direct_or_indirect local_198;
  uint local_188;
  Network local_180;
  uint32_t uStack_17c;
  uint16_t local_178;
  direct_or_indirect local_170;
  shared_count asStack_160 [2];
  uint16_t local_150;
  direct_or_indirect local_148;
  uint local_138;
  Network local_130;
  uint32_t uStack_12c;
  uint16_t local_128;
  direct_or_indirect local_120;
  uint local_110;
  Network local_108;
  uint32_t uStack_104;
  uint16_t local_100;
  direct_or_indirect local_f8;
  shared_count asStack_e8 [2];
  uint16_t local_d8;
  direct_or_indirect local_d0;
  uint local_c0;
  _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_b0;
  direct_or_indirect local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  uint16_t local_58;
  NodeSeconds local_50;
  ServiceFlags local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  consistency_check_ratio =
       GetCheckRatio((NodeContext *)(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_node.args);
  this_00 = (AddrMan *)operator_new(8);
  AddrMan::AddrMan(this_00,&EMPTY_NETGROUPMAN,true,consistency_check_ratio);
  local_408 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_400 = "";
  local_418 = &boost::unit_test::basic_cstring<char_const>::null;
  local_410 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x8c;
  file.m_begin = (iterator)&local_408;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  local_3f8._M_head_impl = this_00;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_418,msg);
  local_b0._M_buckets = &local_b0._M_single_bucket;
  local_b0._M_bucket_count = 1;
  local_b0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_b0._M_element_count = 0;
  local_b0._M_rehash_policy._M_max_load_factor = 1.0;
  local_b0._M_rehash_policy._4_4_ = 0;
  local_b0._M_rehash_policy._M_next_resize = 0;
  local_b0._M_single_bucket = (__node_base_ptr)0x0;
  AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                   *)&local_78,local_3f8._M_head_impl,false,
                  (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)&local_b0);
  bVar2 = CNetAddr::IsValid((CNetAddr *)&local_78);
  local_f8.direct[0] = !bVar2;
  local_f8._8_8_ = 0;
  asStack_e8[0].pi_ = (sp_counted_base *)0x0;
  local_170.indirect_contents.indirect = "!addrman->Select(false).first.IsValid()";
  local_170._8_8_ = (long)"!addrman->Select(false).first.IsValid()" + 0x27;
  local_3c8.__d.__r = (duration)((ulong)local_3c8.__d.__r & 0xffffffffffffff00);
  local_3d0 = (undefined1  [8])&PTR__lazy_ostream_01389048;
  aStack_3c0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_428 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_420 = "";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  aStack_3c0._8_8_ = &local_170;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_f8.indirect_contents,(lazy_ostream *)local_3d0,1,0,WARN,
             _cVar10,(size_t)&local_428,0x8c);
  boost::detail::shared_count::~shared_count(asStack_e8);
  if (0x10 < (uint)local_68._M_allocated_capacity._0_4_) {
    free(local_78.indirect_contents.indirect);
    local_78.indirect_contents.indirect = (char *)0x0;
  }
  std::
  _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_b0);
  local_438 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_430 = "";
  local_448 = &boost::unit_test::basic_cstring<char_const>::null;
  local_440 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x8d;
  file_00.m_begin = (iterator)&local_438;
  msg_00.m_end = pvVar8;
  msg_00.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_448,
             msg_00);
  local_b0._M_buckets = &local_b0._M_single_bucket;
  local_b0._M_bucket_count = 1;
  local_b0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_b0._M_element_count = 0;
  local_b0._M_rehash_policy._M_max_load_factor = 1.0;
  local_b0._M_rehash_policy._4_4_ = 0;
  local_b0._M_rehash_policy._M_next_resize = 0;
  local_b0._M_single_bucket = (__node_base_ptr)0x0;
  AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                   *)&local_78,local_3f8._M_head_impl,true,
                  (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)&local_b0);
  bVar2 = CNetAddr::IsValid((CNetAddr *)&local_78);
  local_f8.direct[0] = !bVar2;
  local_f8._8_8_ = 0;
  asStack_e8[0].pi_ = (sp_counted_base *)0x0;
  local_170.indirect_contents.indirect = "!addrman->Select(true).first.IsValid()";
  local_170._8_8_ = (long)"!addrman->Select(true).first.IsValid()" + 0x26;
  local_3c8.__d.__r = (duration)((ulong)local_3c8.__d.__r & 0xffffffffffffff00);
  local_3d0 = (undefined1  [8])&PTR__lazy_ostream_01389048;
  aStack_3c0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_458 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_450 = "";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  aStack_3c0._8_8_ = &local_170;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_f8.indirect_contents,(lazy_ostream *)local_3d0,1,0,WARN,
             _cVar10,(size_t)&local_458,0x8d);
  boost::detail::shared_count::~shared_count(asStack_e8);
  if (0x10 < (uint)local_68._M_allocated_capacity._0_4_) {
    free(local_78.indirect_contents.indirect);
    local_78.indirect_contents.indirect = (char *)0x0;
  }
  std::
  _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_b0);
  local_78.indirect_contents.indirect = (char *)&local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"252.2.2.2","");
  ResolveIP((CNetAddr *)&local_d0.indirect_contents,(string *)&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.indirect_contents.indirect != &local_68) {
    operator_delete(local_78.indirect_contents.indirect,(ulong)(local_68._M_allocated_capacity + 1))
    ;
  }
  local_78.indirect_contents.indirect = (char *)&local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"250.1.1.1","");
  ResolveService((CService *)&local_f8.indirect_contents,(string *)&local_78,0x208d);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.indirect_contents.indirect != &local_68) {
    operator_delete(local_78.indirect_contents.indirect,(ulong)(local_68._M_allocated_capacity + 1))
    ;
  }
  local_468 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_460 = "";
  local_478 = &boost::unit_test::basic_cstring<char_const>::null;
  local_470 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x93;
  file_01.m_begin = (iterator)&local_468;
  msg_01.m_end = pvVar8;
  msg_01.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_478,
             msg_01);
  _Var1._M_head_impl = local_3f8._M_head_impl;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_120.indirect_contents,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_f8.indirect_contents);
  _local_108 = asStack_e8[1].pi_;
  local_100 = local_d8;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_78,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_120.indirect_contents);
  local_68._8_4_ = local_108;
  local_68._12_4_ = uStack_104;
  local_58 = local_100;
  local_50.__d.__r = (duration)100000000;
  local_48 = NODE_NONE;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_78;
  std::vector<CAddress,_std::allocator<CAddress>_>::vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&local_170,__l,
             (allocator_type *)&local_1e8);
  bVar2 = AddrMan::Add(_Var1._M_head_impl,(vector<CAddress,_std::allocator<CAddress>_> *)&local_170,
                       (CNetAddr *)&local_d0.indirect_contents,(seconds)0x0);
  local_3d0[0] = bVar2;
  local_3c8.__d.__r = (duration)0;
  aStack_3c0._M_allocated_capacity = 0;
  local_b0._M_element_count = (size_type)&local_1c0;
  local_1c0.indirect_contents.indirect = "addrman->Add({CAddress(addr1, NODE_NONE)}, source)";
  local_1c0._8_8_ = (long)"addrman->Add({CAddress(addr1, NODE_NONE)}, source)" + 0x32;
  local_b0._M_bucket_count = local_b0._M_bucket_count & 0xffffffffffffff00;
  local_b0._M_buckets = (__buckets_ptr)&PTR__lazy_ostream_01389048;
  local_b0._M_before_begin._M_nxt = (_Hash_node_base *)boost::unit_test::lazy_ostream::inst;
  local_488 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_480 = "";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_3d0,(lazy_ostream *)&local_b0,1,0,WARN,_cVar10,
             (size_t)&local_488,0x93);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_3c0);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&local_170);
  if (0x10 < (uint)local_68._M_allocated_capacity._0_4_) {
    free(local_78.indirect_contents.indirect);
    local_78.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < local_110) {
    free(local_120.indirect_contents.indirect);
    local_120.indirect_contents.indirect = (char *)0x0;
  }
  local_498 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_490 = "";
  local_4a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x94;
  file_02.m_begin = (iterator)&local_498;
  msg_02.m_end = pvVar8;
  msg_02.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_4a8,
             msg_02);
  local_3c8.__d.__r = (duration)((ulong)local_3c8.__d.__r & 0xffffffffffffff00);
  local_3d0 = (undefined1  [8])&PTR__lazy_ostream_01388f08;
  aStack_3c0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_3c0._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_288.indirect_contents.indirect =
       (char *)AddrMan::Size(local_3f8._M_head_impl,(optional<Network>)0x0,(optional<bool>)0x0);
  local_1e8.indirect_contents.indirect = (char *)&local_288;
  local_260.indirect_contents.indirect = (char *)&local_2b0;
  local_2b0._0_4_ = 1;
  local_170._8_8_ = (element_type *)0x0;
  asStack_160[0].pi_ = (sp_counted_base *)0x0;
  local_1c0.indirect_contents.indirect =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_1c0._8_8_ =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
       + 0x66;
  local_78.direct[8] = '\0';
  local_78.indirect_contents.indirect = (char *)&PTR__lazy_ostream_01388f48;
  local_68._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_68._8_8_ = &local_1e8;
  local_b0._M_element_count = (size_type)&local_260;
  local_b0._M_bucket_count = local_b0._M_bucket_count & 0xffffffffffffff00;
  local_b0._M_buckets = (__buckets_ptr)&PTR__lazy_ostream_01388f88;
  local_b0._M_before_begin._M_nxt = (_Hash_node_base *)boost::unit_test::lazy_ostream::inst;
  pcVar9 = "addrman->Size()";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x2;
  local_170.direct[0] = local_288.indirect_contents.indirect == (char *)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_170,(lazy_ostream *)local_3d0,1,2,REQUIRE,0xe30af9,
             (size_t)&local_1c0,0x94,(iterator)&local_78,"1U",&local_b0);
  boost::detail::shared_count::~shared_count(asStack_160);
  local_4b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_4b0 = "";
  local_4c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x96;
  file_03.m_begin = (iterator)&local_4b8;
  msg_03.m_end = pvVar8;
  msg_03.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_4c8,
             msg_03);
  local_b0._M_buckets = &local_b0._M_single_bucket;
  local_b0._M_bucket_count = 1;
  local_b0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_b0._M_element_count = 0;
  local_b0._M_rehash_policy._M_max_load_factor = 1.0;
  local_b0._M_rehash_policy._4_4_ = 0;
  local_b0._M_rehash_policy._M_next_resize = 0;
  local_b0._M_single_bucket = (__node_base_ptr)0x0;
  AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                   *)&local_78,local_3f8._M_head_impl,true,
                  (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)&local_b0);
  local_170.direct[0] = ::operator==((CService *)&local_78,(CService *)&local_f8.indirect_contents);
  local_170._8_8_ = (element_type *)0x0;
  asStack_160[0].pi_ = (sp_counted_base *)0x0;
  local_1c0.indirect_contents.indirect = "addrman->Select( true).first == addr1";
  local_1c0._8_8_ = (long)"addrman->Select( true).first == addr1" + 0x25;
  local_3c8.__d.__r = (duration)((ulong)local_3c8.__d.__r & 0xffffffffffffff00);
  local_3d0 = (undefined1  [8])&PTR__lazy_ostream_01389048;
  aStack_3c0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_4d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_4d0 = "";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  aStack_3c0._8_8_ = &local_1c0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_170,(lazy_ostream *)local_3d0,1,0,WARN,(check_type)pcVar9,
             (size_t)&local_4d8,0x96);
  boost::detail::shared_count::~shared_count(asStack_160);
  if (0x10 < (uint)local_68._M_allocated_capacity._0_4_) {
    free(local_78.indirect_contents.indirect);
    local_78.indirect_contents.indirect = (char *)0x0;
  }
  std::
  _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_b0);
  local_4e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_4e0 = "";
  local_4f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x97;
  file_04.m_begin = (iterator)&local_4e8;
  msg_04.m_end = pvVar8;
  msg_04.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_4f8,
             msg_04);
  local_b0._M_buckets = &local_b0._M_single_bucket;
  local_b0._M_bucket_count = 1;
  local_b0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_b0._M_element_count = 0;
  local_b0._M_rehash_policy._M_max_load_factor = 1.0;
  local_b0._M_rehash_policy._4_4_ = 0;
  local_b0._M_rehash_policy._M_next_resize = 0;
  local_b0._M_single_bucket = (__node_base_ptr)0x0;
  AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                   *)&local_78,local_3f8._M_head_impl,false,
                  (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)&local_b0);
  bVar2 = ::operator==((CService *)&local_78,(CService *)&local_f8.indirect_contents);
  local_170.direct[0] = bVar2;
  local_170._8_8_ = (element_type *)0x0;
  asStack_160[0].pi_ = (sp_counted_base *)0x0;
  local_1c0.indirect_contents.indirect = "addrman->Select( false).first == addr1";
  local_1c0._8_8_ = (long)"addrman->Select( false).first == addr1" + 0x26;
  local_3c8.__d.__r = (duration)((ulong)local_3c8.__d.__r & 0xffffffffffffff00);
  local_3d0 = (undefined1  [8])&PTR__lazy_ostream_01389048;
  aStack_3c0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_508 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_500 = "";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  aStack_3c0._8_8_ = &local_1c0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_170,(lazy_ostream *)local_3d0,1,0,WARN,(check_type)pcVar9,
             (size_t)&local_508,0x97);
  boost::detail::shared_count::~shared_count(asStack_160);
  if (0x10 < (uint)local_68._M_allocated_capacity._0_4_) {
    free(local_78.indirect_contents.indirect);
    local_78.indirect_contents.indirect = (char *)0x0;
  }
  std::
  _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_b0);
  local_518 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_510 = "";
  local_528 = &boost::unit_test::basic_cstring<char_const>::null;
  local_520 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x9a;
  file_05.m_begin = (iterator)&local_518;
  msg_05.m_end = pvVar8;
  msg_05.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_528,
             msg_05);
  _Var1._M_head_impl = local_3f8._M_head_impl;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_148.indirect_contents,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_f8.indirect_contents);
  _local_130 = asStack_e8[1].pi_;
  local_128 = local_d8;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_78,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_148.indirect_contents);
  local_68._8_4_ = local_130;
  local_68._12_4_ = uStack_12c;
  local_58 = local_128;
  local_50.__d.__r = (duration)100000000;
  local_48 = NODE_NONE;
  tVar5 = NodeClock::now();
  bVar2 = AddrMan::Good(_Var1._M_head_impl,(CService *)&local_78,
                        (NodeSeconds)((long)tVar5.__d.__r / 1000000000));
  local_3d0[0] = bVar2;
  local_3c8.__d.__r = (duration)0;
  aStack_3c0._M_allocated_capacity = 0;
  local_170.indirect_contents.indirect = "addrman->Good(CAddress(addr1, NODE_NONE))";
  local_170._8_8_ = (long)"!addrman->Good(CAddress(addr1, NODE_NONE))" + 0x2a;
  local_b0._M_bucket_count = local_b0._M_bucket_count & 0xffffffffffffff00;
  local_b0._M_buckets = (__buckets_ptr)&PTR__lazy_ostream_01389048;
  local_b0._M_before_begin._M_nxt = (_Hash_node_base *)boost::unit_test::lazy_ostream::inst;
  local_538 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_530 = "";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  local_b0._M_element_count = (size_type)&local_170;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_3d0,(lazy_ostream *)&local_b0,1,0,WARN,(check_type)pcVar9,
             (size_t)&local_538,0x9a);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_3c0);
  if (0x10 < (uint)local_68._M_allocated_capacity._0_4_) {
    free(local_78.indirect_contents.indirect);
    local_78.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < local_138) {
    free(local_148.indirect_contents.indirect);
    local_148.indirect_contents.indirect = (char *)0x0;
  }
  local_548 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_540 = "";
  local_558 = &boost::unit_test::basic_cstring<char_const>::null;
  local_550 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x9c;
  file_06.m_begin = (iterator)&local_548;
  msg_06.m_end = pvVar8;
  msg_06.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_558,
             msg_06);
  local_3c8.__d.__r = (duration)((ulong)local_3c8.__d.__r & 0xffffffffffffff00);
  local_3d0 = (undefined1  [8])&PTR__lazy_ostream_01388f08;
  aStack_3c0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_3c0._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_288.indirect_contents.indirect =
       (char *)AddrMan::Size(local_3f8._M_head_impl,(optional<Network>)0x0,(optional<bool>)0x0);
  local_2b0._0_4_ = 1;
  local_170._8_8_ = (element_type *)0x0;
  asStack_160[0].pi_ = (sp_counted_base *)0x0;
  local_1c0.indirect_contents.indirect =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_1c0._8_8_ =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
       + 0x66;
  local_1e8.indirect_contents.indirect = (char *)&local_288;
  local_78.direct[8] = '\0';
  local_78.indirect_contents.indirect = (char *)&PTR__lazy_ostream_01388f48;
  local_68._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_68._8_8_ = &local_1e8;
  local_260.indirect_contents.indirect = (char *)&local_2b0;
  local_b0._M_bucket_count = local_b0._M_bucket_count & 0xffffffffffffff00;
  local_b0._M_buckets = (__buckets_ptr)&PTR__lazy_ostream_01388f88;
  local_b0._M_before_begin._M_nxt = (_Hash_node_base *)boost::unit_test::lazy_ostream::inst;
  local_b0._M_element_count = (size_type)&local_260;
  pcVar9 = "addrman->Size()";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x2;
  local_170.direct[0] = local_288.indirect_contents.indirect == (char *)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_170,(lazy_ostream *)local_3d0,1,2,REQUIRE,0xe30af9,
             (size_t)&local_1c0,0x9c,(CService *)&local_78,"1U",&local_b0);
  boost::detail::shared_count::~shared_count(asStack_160);
  local_568 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_560 = "";
  local_578 = &boost::unit_test::basic_cstring<char_const>::null;
  local_570 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x9d;
  file_07.m_begin = (iterator)&local_568;
  msg_07.m_end = pvVar8;
  msg_07.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_578,
             msg_07);
  local_b0._M_buckets = &local_b0._M_single_bucket;
  local_b0._M_bucket_count = 1;
  local_b0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_b0._M_element_count = 0;
  local_b0._M_rehash_policy._M_max_load_factor = 1.0;
  local_b0._M_rehash_policy._4_4_ = 0;
  local_b0._M_rehash_policy._M_next_resize = 0;
  local_b0._M_single_bucket = (__node_base_ptr)0x0;
  AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                   *)&local_78,local_3f8._M_head_impl,true,
                  (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)&local_b0);
  bVar2 = CNetAddr::IsValid((CNetAddr *)&local_78);
  local_170.direct[0] = !bVar2;
  local_170._8_8_ = (element_type *)0x0;
  asStack_160[0].pi_ = (sp_counted_base *)0x0;
  local_1c0.indirect_contents.indirect = "!addrman->Select( true).first.IsValid()";
  local_1c0._8_8_ = (long)"!addrman->Select( true).first.IsValid()" + 0x27;
  local_3c8.__d.__r = (duration)((ulong)local_3c8.__d.__r & 0xffffffffffffff00);
  local_3d0 = (undefined1  [8])&PTR__lazy_ostream_01389048;
  aStack_3c0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_588 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_580 = "";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  aStack_3c0._8_8_ = &local_1c0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_170,(lazy_ostream *)local_3d0,1,0,WARN,(check_type)pcVar9,
             (size_t)&local_588,0x9d);
  boost::detail::shared_count::~shared_count(asStack_160);
  if (0x10 < (uint)local_68._M_allocated_capacity._0_4_) {
    free(local_78.indirect_contents.indirect);
    local_78.indirect_contents.indirect = (char *)0x0;
  }
  std::
  _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_b0);
  local_598 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_590 = "";
  local_5a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x9e;
  file_08.m_begin = (iterator)&local_598;
  msg_08.m_end = pvVar8;
  msg_08.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_5a8,
             msg_08);
  local_b0._M_buckets = &local_b0._M_single_bucket;
  local_b0._M_bucket_count = 1;
  local_b0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_b0._M_element_count = 0;
  local_b0._M_rehash_policy._M_max_load_factor = 1.0;
  local_b0._M_rehash_policy._4_4_ = 0;
  local_b0._M_rehash_policy._M_next_resize = 0;
  local_b0._M_single_bucket = (__node_base_ptr)0x0;
  AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                   *)&local_78,local_3f8._M_head_impl,false,
                  (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)&local_b0);
  bVar2 = ::operator==((CService *)&local_78,(CService *)&local_f8.indirect_contents);
  local_170.direct[0] = bVar2;
  local_170._8_8_ = (element_type *)0x0;
  asStack_160[0].pi_ = (sp_counted_base *)0x0;
  local_1c0.indirect_contents.indirect = "addrman->Select().first == addr1";
  local_1c0._8_8_ = (long)"addrman->Select().first == addr1" + 0x20;
  local_3c8.__d.__r = (duration)((ulong)local_3c8.__d.__r & 0xffffffffffffff00);
  local_3d0 = (undefined1  [8])&PTR__lazy_ostream_01389048;
  aStack_3c0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_5b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_5b0 = "";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  aStack_3c0._8_8_ = &local_1c0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_170,(lazy_ostream *)local_3d0,1,0,WARN,(check_type)pcVar9,
             (size_t)&local_5b8,0x9e);
  boost::detail::shared_count::~shared_count(asStack_160);
  if (0x10 < (uint)local_68._M_allocated_capacity._0_4_) {
    free(local_78.indirect_contents.indirect);
    local_78.indirect_contents.indirect = (char *)0x0;
  }
  std::
  _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_b0);
  local_5c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_5c0 = "";
  local_5d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x9f;
  file_09.m_begin = (iterator)&local_5c8;
  msg_09.m_end = pvVar8;
  msg_09.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_5d8,
             msg_09);
  local_3c8.__d.__r = (duration)((ulong)local_3c8.__d.__r & 0xffffffffffffff00);
  local_3d0 = (undefined1  [8])&PTR__lazy_ostream_01388f08;
  aStack_3c0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_3c0._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_288.indirect_contents.indirect =
       (char *)AddrMan::Size(local_3f8._M_head_impl,(optional<Network>)0x0,(optional<bool>)0x0);
  local_2b0._0_4_ = 1;
  local_170.direct[0] = local_288.indirect_contents.indirect == (char *)0x1;
  local_170._8_8_ = (element_type *)0x0;
  asStack_160[0].pi_ = (sp_counted_base *)0x0;
  local_1c0.indirect_contents.indirect =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_1c0._8_8_ =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
       + 0x66;
  local_1e8.indirect_contents.indirect = (char *)&local_288;
  local_78.direct[8] = '\0';
  local_78.indirect_contents.indirect = (char *)&PTR__lazy_ostream_01388f48;
  local_68._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_68._8_8_ = &local_1e8;
  local_260.indirect_contents.indirect = (char *)&local_2b0;
  local_b0._M_bucket_count = local_b0._M_bucket_count & 0xffffffffffffff00;
  local_b0._M_buckets = (__buckets_ptr)&PTR__lazy_ostream_01388f88;
  local_b0._M_before_begin._M_nxt = (_Hash_node_base *)boost::unit_test::lazy_ostream::inst;
  local_b0._M_element_count = (size_type)&local_260;
  pcVar9 = "addrman->Size()";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_170,(lazy_ostream *)local_3d0,1,2,REQUIRE,0xe30af9,
             (size_t)&local_1c0,0x9f,(CService *)&local_78,"1U",&local_b0);
  boost::detail::shared_count::~shared_count(asStack_160);
  local_78.indirect_contents.indirect = (char *)&local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"250.3.1.1","");
  ResolveService((CService *)&local_170,(string *)&local_78,0x208d);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.indirect_contents.indirect != &local_68) {
    operator_delete(local_78.indirect_contents.indirect,(ulong)(local_68._M_allocated_capacity + 1))
    ;
  }
  local_5e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_5e0 = "";
  local_5f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0xa3;
  file_10.m_begin = (iterator)&local_5e8;
  msg_10.m_end = pvVar8;
  msg_10.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_5f8,
             msg_10);
  _Var1._M_head_impl = local_3f8._M_head_impl;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_198.indirect_contents,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_170);
  _local_180 = asStack_160[1].pi_;
  local_178 = local_150;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_78,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_198.indirect_contents);
  local_68._8_4_ = local_180;
  local_68._12_4_ = uStack_17c;
  local_58 = local_178;
  local_50.__d.__r = (duration)100000000;
  local_48 = NODE_NONE;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&local_78;
  std::vector<CAddress,_std::allocator<CAddress>_>::vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&local_1c0,__l_00,
             (allocator_type *)&local_260);
  bVar2 = AddrMan::Add(_Var1._M_head_impl,(vector<CAddress,_std::allocator<CAddress>_> *)&local_1c0,
                       (CNetAddr *)&local_170,(seconds)0x0);
  local_3d0[0] = bVar2;
  local_3c8.__d.__r = (duration)0;
  aStack_3c0._M_allocated_capacity = 0;
  local_1e8.indirect_contents.indirect = "addrman->Add({CAddress(addr2, NODE_NONE)}, addr2)";
  local_1e8._8_8_ = (long)"addrman->Add({CAddress(addr2, NODE_NONE)}, addr2)" + 0x31;
  local_b0._M_bucket_count = local_b0._M_bucket_count & 0xffffffffffffff00;
  local_b0._M_buckets = (__buckets_ptr)&PTR__lazy_ostream_01389048;
  local_b0._M_before_begin._M_nxt = (_Hash_node_base *)boost::unit_test::lazy_ostream::inst;
  local_b0._M_element_count = (size_type)&local_1e8;
  local_608 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_600 = "";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_3d0,(lazy_ostream *)&local_b0,1,0,WARN,(check_type)pcVar9,
             (size_t)&local_608,0xa3);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_3c0);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&local_1c0);
  if (0x10 < (uint)local_68._M_allocated_capacity._0_4_) {
    free(local_78.indirect_contents.indirect);
    local_78.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < local_188) {
    free(local_198.indirect_contents.indirect);
    local_198.indirect_contents.indirect = (char *)0x0;
  }
  local_618 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_610 = "";
  local_628 = &boost::unit_test::basic_cstring<char_const>::null;
  local_620 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0xa4;
  file_11.m_begin = (iterator)&local_618;
  msg_11.m_end = pvVar8;
  msg_11.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_628,
             msg_11);
  local_b0._M_buckets = &local_b0._M_single_bucket;
  local_b0._M_bucket_count = 1;
  local_b0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_b0._M_element_count = 0;
  local_b0._M_rehash_policy._M_max_load_factor = 1.0;
  local_b0._M_rehash_policy._4_4_ = 0;
  local_b0._M_rehash_policy._M_next_resize = 0;
  local_b0._M_single_bucket = (__node_base_ptr)0x0;
  AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                   *)&local_78,local_3f8._M_head_impl,true,
                  (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)&local_b0);
  bVar2 = ::operator==((CService *)&local_78,(CService *)&local_170);
  local_1c0.direct[0] = bVar2;
  local_1c0._8_8_ = (element_type *)0x0;
  asStack_1b0[0].pi_ = (sp_counted_base *)0x0;
  local_1e8.indirect_contents.indirect = "addrman->Select( true).first == addr2";
  local_1e8._8_8_ = (long)"addrman->Select( true).first == addr2" + 0x25;
  local_3c8.__d.__r = (duration)((ulong)local_3c8.__d.__r & 0xffffffffffffff00);
  local_3d0 = (undefined1  [8])&PTR__lazy_ostream_01389048;
  aStack_3c0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_3c0._8_8_ = &local_1e8;
  local_638 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_630 = "";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_1c0,(lazy_ostream *)local_3d0,1,0,WARN,(check_type)pcVar9,
             (size_t)&local_638,0xa4);
  boost::detail::shared_count::~shared_count(asStack_1b0);
  if (0x10 < (uint)local_68._M_allocated_capacity._0_4_) {
    free(local_78.indirect_contents.indirect);
    local_78.indirect_contents.indirect = (char *)0x0;
  }
  std::
  _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_b0);
  local_78.indirect_contents.indirect = (char *)&local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"250.3.2.2","");
  ResolveService((CService *)&local_1c0,(string *)&local_78,9999);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.indirect_contents.indirect != &local_68) {
    operator_delete(local_78.indirect_contents.indirect,(ulong)(local_68._M_allocated_capacity + 1))
    ;
  }
  local_78.indirect_contents.indirect = (char *)&local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"250.3.3.3","");
  ResolveService((CService *)&local_1e8,(string *)&local_78,9999);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.indirect_contents.indirect != &local_68) {
    operator_delete(local_78.indirect_contents.indirect,(ulong)(local_68._M_allocated_capacity + 1))
    ;
  }
  local_648 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_640 = "";
  local_658 = &boost::unit_test::basic_cstring<char_const>::null;
  local_650 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0xaa;
  file_12.m_begin = (iterator)&local_648;
  msg_12.m_end = pvVar8;
  msg_12.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_658,
             msg_12);
  _Var1._M_head_impl = local_3f8._M_head_impl;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_210.indirect_contents,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_1c0);
  _local_1f8 = asStack_1b0[1].pi_;
  local_1f0 = local_1a0;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_78,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_210.indirect_contents);
  local_68._8_4_ = local_1f8;
  local_68._12_4_ = uStack_1f4;
  local_58 = local_1f0;
  local_50.__d.__r = (duration)100000000;
  local_48 = NODE_NONE;
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)&local_78;
  std::vector<CAddress,_std::allocator<CAddress>_>::vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&local_260,__l_01,
             (allocator_type *)&local_2b0.indirect_contents);
  bVar2 = AddrMan::Add(_Var1._M_head_impl,(vector<CAddress,_std::allocator<CAddress>_> *)&local_260,
                       (CNetAddr *)&local_170,(seconds)0x0);
  local_3d0[0] = bVar2;
  local_3c8.__d.__r = (duration)0;
  aStack_3c0._M_allocated_capacity = 0;
  local_288.indirect_contents.indirect = "addrman->Add({CAddress(addr3, NODE_NONE)}, addr2)";
  local_288._8_8_ = (long)"addrman->Add({CAddress(addr3, NODE_NONE)}, addr2)" + 0x31;
  local_b0._M_bucket_count = local_b0._M_bucket_count & 0xffffffffffffff00;
  local_b0._M_buckets = (__buckets_ptr)&PTR__lazy_ostream_01389048;
  local_b0._M_before_begin._M_nxt = (_Hash_node_base *)boost::unit_test::lazy_ostream::inst;
  local_b0._M_element_count = (size_type)&local_288;
  local_668 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_660 = "";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_3d0,(lazy_ostream *)&local_b0,1,0,WARN,(check_type)pcVar9,
             (size_t)&local_668,0xaa);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_3c0);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&local_260);
  if (0x10 < (uint)local_68._M_allocated_capacity._0_4_) {
    free(local_78.indirect_contents.indirect);
    local_78.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < local_200) {
    free(local_210.indirect_contents.indirect);
    local_210.indirect_contents.indirect = (char *)0x0;
  }
  local_678 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_670 = "";
  local_688 = &boost::unit_test::basic_cstring<char_const>::null;
  local_680 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0xab;
  file_13.m_begin = (iterator)&local_678;
  msg_13.m_end = pvVar8;
  msg_13.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_688,
             msg_13);
  _Var1._M_head_impl = local_3f8._M_head_impl;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_238.indirect_contents,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_1e8);
  local_220 = local_1d0;
  uStack_21c = uStack_1cc;
  local_218 = local_1c8;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_78,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_238.indirect_contents);
  local_68._8_4_ = local_220;
  local_68._12_4_ = uStack_21c;
  local_58 = local_218;
  local_50.__d.__r = (duration)100000000;
  local_48 = NODE_NONE;
  __l_02._M_len = 1;
  __l_02._M_array = (iterator)&local_78;
  std::vector<CAddress,_std::allocator<CAddress>_>::vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&local_2b0.indirect_contents,__l_02,
             (allocator_type *)&local_3e8);
  local_3d0 = (undefined1  [8])&aStack_3c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"250.4.1.1","");
  ResolveService((CService *)&local_b0,(string *)local_3d0,0x208d);
  bVar2 = AddrMan::Add(_Var1._M_head_impl,
                       (vector<CAddress,_std::allocator<CAddress>_> *)&local_2b0.indirect_contents,
                       (CNetAddr *)&local_b0,(seconds)0x0);
  local_288.direct[0] = bVar2;
  local_288._8_8_ = (element_type *)0x0;
  asStack_278[0].pi_ = (sp_counted_base *)0x0;
  local_248 = (undefined ***)&local_7b0;
  local_7b0._0_8_ =
       "addrman->Add({CAddress(addr4, NODE_NONE)}, ResolveService(\"250.4.1.1\", 8333))";
  local_7b0.m_message.px = (element_type *)0xe30f2b;
  local_260.direct[8] = false;
  local_260.indirect_contents.indirect = (char *)&PTR__lazy_ostream_01389048;
  local_250 = boost::unit_test::lazy_ostream::inst;
  local_698 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_690 = "";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_288,(lazy_ostream *)&local_260,1,0,WARN,(check_type)pcVar9,
             (size_t)&local_698,0xab);
  boost::detail::shared_count::~shared_count(asStack_278);
  if (0x10 < (uint)local_b0._M_before_begin._M_nxt) {
    free(local_b0._M_buckets);
    local_b0._M_buckets = (__buckets_ptr)0x0;
  }
  if (local_3d0 != (undefined1  [8])&aStack_3c0) {
    operator_delete((void *)local_3d0,(ulong)(aStack_3c0._M_allocated_capacity + 1));
  }
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&local_2b0.indirect_contents);
  if (0x10 < (uint)local_68._M_allocated_capacity._0_4_) {
    free(local_78.indirect_contents.indirect);
    local_78.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < local_228) {
    free(local_238.indirect_contents.indirect);
    local_238.indirect_contents.indirect = (char *)0x0;
  }
  local_78.indirect_contents.indirect = (char *)&local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"250.4.4.4","");
  ResolveService((CService *)&local_260,(string *)&local_78,0x208d);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.indirect_contents.indirect != &local_68) {
    operator_delete(local_78.indirect_contents.indirect,(ulong)(local_68._M_allocated_capacity + 1))
    ;
  }
  local_78.indirect_contents.indirect = (char *)&local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"250.4.5.5","");
  ResolveService((CService *)&local_288,(string *)&local_78,0x1e61);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.indirect_contents.indirect != &local_68) {
    operator_delete(local_78.indirect_contents.indirect,(ulong)(local_68._M_allocated_capacity + 1))
    ;
  }
  local_78.indirect_contents.indirect = (char *)&local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"250.4.6.6","");
  ResolveService((CService *)&local_2b0.indirect_contents,(string *)&local_78,0x208d);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.indirect_contents.indirect != &local_68) {
    operator_delete(local_78.indirect_contents.indirect,(ulong)(local_68._M_allocated_capacity + 1))
    ;
  }
  local_6a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_6a0 = "";
  local_6b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0xb2;
  file_14.m_begin = (iterator)&local_6a8;
  msg_14.m_end = pvVar8;
  msg_14.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_6b8,
             msg_14);
  _Var1._M_head_impl = local_3f8._M_head_impl;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_2d8.indirect_contents,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_260);
  local_2c0 = local_248;
  local_2b8 = local_240;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_78,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_2d8.indirect_contents);
  local_68._8_8_ = local_2c0;
  local_58 = local_2b8;
  local_50.__d.__r = (duration)100000000;
  local_48 = NODE_NONE;
  __l_03._M_len = 1;
  __l_03._M_array = (iterator)&local_78;
  std::vector<CAddress,_std::allocator<CAddress>_>::vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&local_7b0,__l_03,
             (allocator_type *)&local_790);
  bVar2 = AddrMan::Add(_Var1._M_head_impl,(vector<CAddress,_std::allocator<CAddress>_> *)&local_7b0,
                       (CNetAddr *)&local_1c0,(seconds)0x0);
  local_3d0[0] = bVar2;
  local_3c8.__d.__r = (duration)0;
  aStack_3c0._M_allocated_capacity = 0;
  local_3e8._0_8_ = "addrman->Add({CAddress(addr5, NODE_NONE)}, addr3)";
  local_3e8.m_message.px = (element_type *)0xe30f7b;
  local_b0._M_bucket_count = local_b0._M_bucket_count & 0xffffffffffffff00;
  local_b0._M_buckets = (__buckets_ptr)&PTR__lazy_ostream_01389048;
  local_b0._M_before_begin._M_nxt = (_Hash_node_base *)boost::unit_test::lazy_ostream::inst;
  local_6c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_6c0 = "";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  local_b0._M_element_count = (size_type)&local_3e8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_3d0,(lazy_ostream *)&local_b0,1,0,WARN,(check_type)pcVar9,
             (size_t)&local_6c8,0xb2);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_3c0);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&local_7b0);
  if (0x10 < (uint)local_68._M_allocated_capacity._0_4_) {
    free(local_78.indirect_contents.indirect);
    local_78.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < local_2c8) {
    free(local_2d8.indirect_contents.indirect);
    local_2d8.indirect_contents.indirect = (char *)0x0;
  }
  local_6d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_6d0 = "";
  local_6e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_15.m_end = (iterator)0xb3;
  file_15.m_begin = (iterator)&local_6d8;
  msg_15.m_end = pvVar8;
  msg_15.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_6e8,
             msg_15);
  _Var1._M_head_impl = local_3f8._M_head_impl;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_300.indirect_contents,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_260);
  local_2e8 = local_248;
  local_2e0 = local_240;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_78,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_300.indirect_contents);
  local_68._8_8_ = local_2e8;
  local_58 = local_2e0;
  local_50.__d.__r = (duration)100000000;
  local_48 = NODE_NONE;
  tVar5 = NodeClock::now();
  bVar2 = AddrMan::Good(_Var1._M_head_impl,(CService *)&local_78,
                        (NodeSeconds)((long)tVar5.__d.__r / 1000000000));
  local_3d0[0] = bVar2;
  local_3c8.__d.__r = (duration)0;
  aStack_3c0._M_allocated_capacity = 0;
  local_7b0._0_8_ = "addrman->Good(CAddress(addr5, NODE_NONE))";
  local_7b0.m_message.px = (element_type *)0xe30fa5;
  local_b0._M_bucket_count = local_b0._M_bucket_count & 0xffffffffffffff00;
  local_b0._M_buckets = (__buckets_ptr)&PTR__lazy_ostream_01389048;
  local_b0._M_before_begin._M_nxt = (_Hash_node_base *)boost::unit_test::lazy_ostream::inst;
  local_6f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_6f0 = "";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  local_b0._M_element_count = (size_type)&local_7b0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_3d0,(lazy_ostream *)&local_b0,1,0,WARN,(check_type)pcVar9,
             (size_t)&local_6f8,0xb3);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_3c0);
  if (0x10 < (uint)local_68._M_allocated_capacity._0_4_) {
    free(local_78.indirect_contents.indirect);
    local_78.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < local_2f0) {
    free(local_300.indirect_contents.indirect);
    local_300.indirect_contents.indirect = (char *)0x0;
  }
  local_708 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_700 = "";
  local_718 = &boost::unit_test::basic_cstring<char_const>::null;
  local_710 = &boost::unit_test::basic_cstring<char_const>::null;
  file_16.m_end = (iterator)0xb4;
  file_16.m_begin = (iterator)&local_708;
  msg_16.m_end = pvVar8;
  msg_16.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_718,
             msg_16);
  _Var1._M_head_impl = local_3f8._M_head_impl;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_328.indirect_contents,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_288);
  _local_310 = asStack_278[1].pi_;
  local_308 = local_268;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_78,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_328.indirect_contents);
  local_68._8_4_ = local_310;
  local_68._12_4_ = uStack_30c;
  local_58 = local_308;
  local_50.__d.__r = (duration)100000000;
  local_48 = NODE_NONE;
  __l_04._M_len = 1;
  __l_04._M_array = (iterator)&local_78;
  std::vector<CAddress,_std::allocator<CAddress>_>::vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&local_7b0,__l_04,
             (allocator_type *)&local_790);
  bVar2 = AddrMan::Add(_Var1._M_head_impl,(vector<CAddress,_std::allocator<CAddress>_> *)&local_7b0,
                       (CNetAddr *)&local_1c0,(seconds)0x0);
  local_3d0[0] = bVar2;
  local_3c8.__d.__r = (duration)0;
  aStack_3c0._M_allocated_capacity = 0;
  local_3e8._0_8_ = "addrman->Add({CAddress(addr6, NODE_NONE)}, addr3)";
  local_3e8.m_message.px = (element_type *)0xe30fd7;
  local_b0._M_bucket_count = local_b0._M_bucket_count & 0xffffffffffffff00;
  local_b0._M_buckets = (__buckets_ptr)&PTR__lazy_ostream_01389048;
  local_b0._M_before_begin._M_nxt = (_Hash_node_base *)boost::unit_test::lazy_ostream::inst;
  local_728 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_720 = "";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  local_b0._M_element_count = (size_type)&local_3e8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_3d0,(lazy_ostream *)&local_b0,1,0,WARN,(check_type)pcVar9,
             (size_t)&local_728,0xb4);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_3c0);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&local_7b0);
  if (0x10 < (uint)local_68._M_allocated_capacity._0_4_) {
    free(local_78.indirect_contents.indirect);
    local_78.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < local_318) {
    free(local_328.indirect_contents.indirect);
    local_328.indirect_contents.indirect = (char *)0x0;
  }
  local_738 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_730 = "";
  local_748 = &boost::unit_test::basic_cstring<char_const>::null;
  local_740 = &boost::unit_test::basic_cstring<char_const>::null;
  file_17.m_end = (iterator)0xb5;
  file_17.m_begin = (iterator)&local_738;
  msg_17.m_end = pvVar8;
  msg_17.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_748,
             msg_17);
  _Var1._M_head_impl = local_3f8._M_head_impl;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_350.indirect_contents,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_288);
  _local_338 = asStack_278[1].pi_;
  local_330 = local_268;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_78,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_350.indirect_contents);
  local_68._8_4_ = local_338;
  local_68._12_4_ = uStack_334;
  local_58 = local_330;
  local_50.__d.__r = (duration)100000000;
  local_48 = NODE_NONE;
  tVar5 = NodeClock::now();
  bVar2 = AddrMan::Good(_Var1._M_head_impl,(CService *)&local_78,
                        (NodeSeconds)((long)tVar5.__d.__r / 1000000000));
  local_3d0[0] = bVar2;
  local_3c8.__d.__r = (duration)0;
  aStack_3c0._M_allocated_capacity = 0;
  local_7b0._0_8_ = "addrman->Good(CAddress(addr6, NODE_NONE))";
  local_7b0.m_message.px = (element_type *)0xe31001;
  local_b0._M_bucket_count = local_b0._M_bucket_count & 0xffffffffffffff00;
  local_b0._M_buckets = (__buckets_ptr)&PTR__lazy_ostream_01389048;
  local_b0._M_before_begin._M_nxt = (_Hash_node_base *)boost::unit_test::lazy_ostream::inst;
  local_758 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_750 = "";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  local_b0._M_element_count = (size_type)&local_7b0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_3d0,(lazy_ostream *)&local_b0,1,0,WARN,(check_type)pcVar9,
             (size_t)&local_758,0xb5);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_3c0);
  if (0x10 < (uint)local_68._M_allocated_capacity._0_4_) {
    free(local_78.indirect_contents.indirect);
    local_78.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < local_340) {
    free(local_350.indirect_contents.indirect);
    local_350.indirect_contents.indirect = (char *)0x0;
  }
  local_768 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_760 = "";
  local_778 = &boost::unit_test::basic_cstring<char_const>::null;
  local_770 = &boost::unit_test::basic_cstring<char_const>::null;
  file_18.m_end = (iterator)0xb6;
  file_18.m_begin = (iterator)&local_768;
  msg_18.m_end = pvVar8;
  msg_18.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_778,
             msg_18);
  _Var1._M_head_impl = local_3f8._M_head_impl;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_378.indirect_contents,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_2b0.indirect_contents);
  local_360 = local_298;
  uStack_35c = uStack_294;
  local_358 = local_290;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_78,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_378.indirect_contents);
  local_68._8_4_ = local_360;
  local_68._12_4_ = uStack_35c;
  local_58 = local_358;
  local_50.__d.__r = (duration)100000000;
  local_48 = NODE_NONE;
  __l_05._M_len = 1;
  __l_05._M_array = (iterator)&local_78;
  std::vector<CAddress,_std::allocator<CAddress>_>::vector
            (&local_790,__l_05,(allocator_type *)local_3f0);
  local_3d0 = (undefined1  [8])&aStack_3c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"250.1.1.3","");
  ResolveService((CService *)&local_b0,(string *)local_3d0,0x208d);
  rVar3.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       AddrMan::Add(_Var1._M_head_impl,&local_790,(CNetAddr *)&local_b0,(seconds)0x0);
  local_3e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       rVar3.super_readonly_property<bool>.super_class_property<bool>.value;
  local_3e8.m_message.px = (element_type *)0x0;
  local_3e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_798 = &local_7c0;
  local_7c0 = (size_t *)0xe31002;
  local_7b8 = "";
  local_7b0.m_message.px = (element_type *)((ulong)local_7b0.m_message.px & 0xffffffffffffff00);
  local_7b0._0_8_ = &PTR__lazy_ostream_01389048;
  local_7b0.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_7d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_7c8 = "";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_3e8,(lazy_ostream *)&local_7b0,1,0,WARN,(check_type)pcVar9,(size_t)&local_7d0,
             0xb6);
  boost::detail::shared_count::~shared_count(&local_3e8.m_message.pn);
  if (0x10 < (uint)local_b0._M_before_begin._M_nxt) {
    free(local_b0._M_buckets);
    local_b0._M_buckets = (__buckets_ptr)0x0;
  }
  if (local_3d0 != (undefined1  [8])&aStack_3c0) {
    operator_delete((void *)local_3d0,(ulong)(aStack_3c0._M_allocated_capacity + 1));
  }
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&local_790);
  if (0x10 < (uint)local_68._M_allocated_capacity._0_4_) {
    free(local_78.indirect_contents.indirect);
    local_78.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < local_368) {
    free(local_378.indirect_contents.indirect);
    local_378.indirect_contents.indirect = (char *)0x0;
  }
  local_7e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_7d8 = "";
  local_7f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_19.m_end = (iterator)0xb7;
  file_19.m_begin = (iterator)&local_7e0;
  msg_19.m_end = pvVar8;
  msg_19.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_7f0,
             msg_19);
  _Var1._M_head_impl = local_3f8._M_head_impl;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_3a0.indirect_contents,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_2b0.indirect_contents);
  local_388 = local_298;
  uStack_384 = uStack_294;
  local_380 = local_290;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_78,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_3a0.indirect_contents);
  local_68._8_4_ = local_388;
  local_68._12_4_ = uStack_384;
  local_58 = local_380;
  local_50.__d.__r = (duration)100000000;
  local_48 = NODE_NONE;
  tVar5 = NodeClock::now();
  bVar2 = AddrMan::Good(_Var1._M_head_impl,(CService *)&local_78,
                        (NodeSeconds)((long)tVar5.__d.__r / 1000000000));
  local_3d0[0] = bVar2;
  local_3c8.__d.__r = (duration)0;
  aStack_3c0._M_allocated_capacity = 0;
  local_7b0._0_8_ = "addrman->Good(CAddress(addr7, NODE_NONE))";
  local_7b0.m_message.px = (element_type *)0xe31079;
  local_b0._M_bucket_count = local_b0._M_bucket_count & 0xffffffffffffff00;
  local_b0._M_buckets = (__buckets_ptr)&PTR__lazy_ostream_01389048;
  local_b0._M_before_begin._M_nxt = (_Hash_node_base *)boost::unit_test::lazy_ostream::inst;
  local_800 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_7f8 = "";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  local_b0._M_element_count = (size_type)&local_7b0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_3d0,(lazy_ostream *)&local_b0,1,0,WARN,(check_type)pcVar9,
             (size_t)&local_800,0xb7);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_3c0);
  if (0x10 < (uint)local_68._M_allocated_capacity._0_4_) {
    free(local_78.indirect_contents.indirect);
    local_78.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < local_390) {
    free(local_3a0.indirect_contents.indirect);
    local_3a0.indirect_contents.indirect = (char *)0x0;
  }
  local_810 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_808 = "";
  local_820 = &boost::unit_test::basic_cstring<char_const>::null;
  local_818 = &boost::unit_test::basic_cstring<char_const>::null;
  file_20.m_end = (iterator)0xba;
  file_20.m_begin = (iterator)&local_810;
  msg_20.m_end = pvVar8;
  msg_20.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_820,
             msg_20);
  local_3c8.__d.__r = (duration)((ulong)local_3c8.__d.__r & 0xffffffffffffff00);
  local_3d0 = (undefined1  [8])&PTR__lazy_ostream_01388f08;
  aStack_3c0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_3c0._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_3f0 = (undefined1  [8])
              AddrMan::Size(local_3f8._M_head_impl,(optional<Network>)0x0,(optional<bool>)0x0);
  local_7c0 = &local_848;
  local_848 = CONCAT44(local_848._4_4_,7);
  local_7b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(local_3f0 == (undefined1  [8])0x7);
  local_7b0.m_message.px = (element_type *)0x0;
  local_7b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_3e8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_3e8.m_message.px = (element_type *)0xe30adf;
  local_790.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_3f0;
  local_78.direct[8] = '\0';
  local_78.indirect_contents.indirect = (char *)&PTR__lazy_ostream_01388f48;
  local_68._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_b0._M_bucket_count = local_b0._M_bucket_count & 0xffffffffffffff00;
  local_b0._M_buckets = (__buckets_ptr)&PTR__lazy_ostream_01388f88;
  local_b0._M_before_begin._M_nxt = (_Hash_node_base *)boost::unit_test::lazy_ostream::inst;
  local_b0._M_element_count = (size_type)&local_7c0;
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x2;
  local_68._8_8_ = &local_790;
  boost::test_tools::tt_detail::report_assertion
            (&local_7b0,(lazy_ostream *)local_3d0,1,2,REQUIRE,0xe30af9,(size_t)&local_3e8,0xba,
             (CService *)&local_78,"7U",&local_b0);
  boost::detail::shared_count::~shared_count(&local_7b0.m_message.pn);
  aStack_3c0._8_8_ = &local_3c8;
  local_3c8.__d.__r = (duration)((ulong)local_3c8.__d.__r & 0xffffffff00000000);
  aStack_3c0._M_allocated_capacity = 0;
  local_3a8 = 0;
  iVar6 = 0x14;
  local_3b0 = (_Base_ptr)aStack_3c0._8_8_;
  do {
    local_b0._M_buckets = &local_b0._M_single_bucket;
    local_b0._M_bucket_count = 1;
    local_b0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_b0._M_element_count = 0;
    local_b0._M_rehash_policy._M_max_load_factor = 1.0;
    local_b0._M_rehash_policy._4_4_ = 0;
    local_b0._M_rehash_policy._M_next_resize = 0;
    local_b0._M_single_bucket = (__node_base_ptr)0x0;
    AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                     *)&local_78,local_3f8._M_head_impl,false,
                    (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                     *)&local_b0);
    uVar4 = CService::GetPort((CService *)&local_78);
    local_7b0._0_2_ = uVar4;
    std::
    _Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
    ::_M_insert_unique<unsigned_short>
              ((_Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
                *)local_3d0,(unsigned_short *)&local_7b0);
    if (0x10 < (uint)local_68._M_allocated_capacity._0_4_) {
      free(local_78.indirect_contents.indirect);
      local_78.indirect_contents.indirect = (char *)0x0;
    }
    std::
    _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&local_b0);
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  local_830 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_828 = "";
  local_840 = &boost::unit_test::basic_cstring<char_const>::null;
  local_838 = &boost::unit_test::basic_cstring<char_const>::null;
  file_21.m_end = (iterator)0xc1;
  file_21.m_begin = (iterator)&local_830;
  msg_21.m_end = pvVar8;
  msg_21.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_840,
             msg_21);
  local_7b0.m_message.px = (element_type *)((ulong)local_7b0.m_message.px & 0xffffffffffffff00);
  local_7b0._0_8_ = &PTR__lazy_ostream_01388f08;
  local_7b0.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_798 = (size_t **)0xf4aea1;
  local_848 = local_3a8;
  local_3f0 = (undefined1  [8])local_84c;
  local_3e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(local_3a8 == 3);
  local_84c[0] = '\x03';
  local_84c[1] = '\0';
  local_84c[2] = '\0';
  local_84c[3] = '\0';
  local_3e8.m_message.px = (element_type *)0x0;
  local_3e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_790.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0xe30a79;
  local_790.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xe30adf;
  local_7c0 = &local_848;
  local_78.direct[8] = '\0';
  local_78.indirect_contents.indirect = (char *)&PTR__lazy_ostream_01388f48;
  local_68._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_68._8_8_ = &local_7c0;
  local_b0._M_bucket_count = local_b0._M_bucket_count & 0xffffffffffffff00;
  local_b0._M_buckets = (__buckets_ptr)&PTR__lazy_ostream_01388f88;
  local_b0._M_before_begin._M_nxt = (_Hash_node_base *)boost::unit_test::lazy_ostream::inst;
  local_b0._M_element_count = (size_type)local_3f0;
  boost::test_tools::tt_detail::report_assertion
            (&local_3e8,(lazy_ostream *)&local_7b0,1,2,REQUIRE,0xe3107a,(size_t)&local_790,0xc1,
             (pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
              *)&local_78,"3U",&local_b0);
  boost::detail::shared_count::~shared_count(&local_3e8.m_message.pn);
  std::
  _Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
  ::~_Rb_tree((_Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
               *)local_3d0);
  if (0x10 < local_2a0) {
    free((void *)CONCAT44(local_2b0._4_4_,local_2b0._0_4_));
  }
  if (0x10 < (uint)asStack_278[0].pi_) {
    free(local_288.indirect_contents.indirect);
  }
  if (0x10 < (uint)local_250) {
    free(local_260.indirect_contents.indirect);
  }
  if (0x10 < local_1d8) {
    free(local_1e8.indirect_contents.indirect);
  }
  if (0x10 < (uint)asStack_1b0[0].pi_) {
    free(local_1c0.indirect_contents.indirect);
  }
  if (0x10 < (uint)asStack_160[0].pi_) {
    free(local_170.indirect_contents.indirect);
  }
  if (0x10 < (uint)asStack_e8[0].pi_) {
    free((void *)CONCAT71(local_f8._1_7_,local_f8.direct[0]));
  }
  if (0x10 < local_c0) {
    free(local_d0.indirect_contents.indirect);
  }
  std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::~unique_ptr
            ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)&local_3f8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(addrman_select)
{
    auto addrman = std::make_unique<AddrMan>(EMPTY_NETGROUPMAN, DETERMINISTIC, GetCheckRatio(m_node));
    BOOST_CHECK(!addrman->Select(false).first.IsValid());
    BOOST_CHECK(!addrman->Select(true).first.IsValid());

    CNetAddr source = ResolveIP("252.2.2.2");

    // Add 1 address to the new table
    CService addr1 = ResolveService("250.1.1.1", 8333);
    BOOST_CHECK(addrman->Add({CAddress(addr1, NODE_NONE)}, source));
    BOOST_CHECK_EQUAL(addrman->Size(), 1U);

    BOOST_CHECK(addrman->Select(/*new_only=*/true).first == addr1);
    BOOST_CHECK(addrman->Select(/*new_only=*/false).first == addr1);

    // Move address to the tried table
    BOOST_CHECK(addrman->Good(CAddress(addr1, NODE_NONE)));

    BOOST_CHECK_EQUAL(addrman->Size(), 1U);
    BOOST_CHECK(!addrman->Select(/*new_only=*/true).first.IsValid());
    BOOST_CHECK(addrman->Select().first == addr1);
    BOOST_CHECK_EQUAL(addrman->Size(), 1U);

    // Add one address to the new table
    CService addr2 = ResolveService("250.3.1.1", 8333);
    BOOST_CHECK(addrman->Add({CAddress(addr2, NODE_NONE)}, addr2));
    BOOST_CHECK(addrman->Select(/*new_only=*/true).first == addr2);

    // Add two more addresses to the new table
    CService addr3 = ResolveService("250.3.2.2", 9999);
    CService addr4 = ResolveService("250.3.3.3", 9999);

    BOOST_CHECK(addrman->Add({CAddress(addr3, NODE_NONE)}, addr2));
    BOOST_CHECK(addrman->Add({CAddress(addr4, NODE_NONE)}, ResolveService("250.4.1.1", 8333)));

    // Add three addresses to tried table.
    CService addr5 = ResolveService("250.4.4.4", 8333);
    CService addr6 = ResolveService("250.4.5.5", 7777);
    CService addr7 = ResolveService("250.4.6.6", 8333);

    BOOST_CHECK(addrman->Add({CAddress(addr5, NODE_NONE)}, addr3));
    BOOST_CHECK(addrman->Good(CAddress(addr5, NODE_NONE)));
    BOOST_CHECK(addrman->Add({CAddress(addr6, NODE_NONE)}, addr3));
    BOOST_CHECK(addrman->Good(CAddress(addr6, NODE_NONE)));
    BOOST_CHECK(addrman->Add({CAddress(addr7, NODE_NONE)}, ResolveService("250.1.1.3", 8333)));
    BOOST_CHECK(addrman->Good(CAddress(addr7, NODE_NONE)));

    // 6 addrs + 1 addr from last test = 7.
    BOOST_CHECK_EQUAL(addrman->Size(), 7U);

    // Select pulls from new and tried regardless of port number.
    std::set<uint16_t> ports;
    for (int i = 0; i < 20; ++i) {
        ports.insert(addrman->Select().first.GetPort());
    }
    BOOST_CHECK_EQUAL(ports.size(), 3U);
}